

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O3

Vec_Int_t * Mf_ManDeriveCnfs(Mf_Man_t *p,int *pnVars,int *pnClas,int *pnLits)

{
  uint uVar1;
  size_t __n;
  Vec_Mem_t *pVVar2;
  word wVar3;
  Vec_Int_t *pVVar4;
  void *pvVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  bool bVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  Vec_Int_t *p_00;
  int *piVar13;
  Gia_Man_t *pGVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  bool bVar20;
  uint uVar21;
  Mf_Man_t *pMVar22;
  int iVar23;
  ulong uVar24;
  bool bVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  int pCnf [512];
  uint local_894;
  ulong local_890;
  void *local_888;
  int **local_880;
  ulong local_878;
  int *local_870;
  int *local_868;
  int *local_860;
  Mf_Man_t *local_858;
  ulong local_850;
  void *local_848;
  int *local_840;
  uint local_838 [514];
  uint uVar47;
  uint uVar49;
  
  uVar26 = (p->vCnfSizes).nSize;
  local_890 = (ulong)uVar26;
  uVar15 = uVar26;
  if (uVar26 - 1 < 0xf) {
    uVar15 = 0x10;
  }
  local_870 = pnLits;
  local_868 = pnClas;
  local_860 = pnVars;
  if (uVar15 == 0) {
    local_888 = (void *)0x0;
  }
  else {
    local_888 = malloc((long)(int)uVar15 << 2);
  }
  __n = (long)(int)uVar26 * 4;
  memset(local_888,0,__n);
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar11 = uVar26 * 3;
  if (uVar26 * 3 - 1 < 0xf) {
    iVar11 = 0x10;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar11;
  if (iVar11 == 0) {
    local_880 = &p_00->pArray;
    p_00->pArray = (int *)0x0;
    uVar27 = local_890;
    if ((int)local_890 < 1) goto LAB_0071cfbc;
LAB_0071cf85:
    uVar27 = local_890;
    local_880 = &p_00->pArray;
    piVar13 = (int *)malloc(__n);
LAB_0071cf8d:
    *local_880 = piVar13;
    if (piVar13 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p_00->nCap = (int)uVar27;
  }
  else {
    piVar13 = (int *)malloc((long)iVar11 << 2);
    uVar27 = local_890;
    local_880 = &p_00->pArray;
    p_00->pArray = piVar13;
    if (iVar11 < (int)local_890) {
      if (piVar13 == (int *)0x0) goto LAB_0071cf85;
      piVar13 = (int *)realloc(piVar13,__n);
      goto LAB_0071cf8d;
    }
  }
  if (0 < (int)uVar27) {
    memset(piVar13,0xff,uVar27 * 4);
  }
LAB_0071cfbc:
  p_00->nSize = (int)uVar27;
  if (8 < p->pPars->nLutSize) {
    __assert_fail("p->pPars->nLutSize <= 8",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                  ,0x10a,"Vec_Int_t *Mf_ManDeriveCnfs(Mf_Man_t *, int *, int *, int *)");
  }
  bVar25 = false;
  local_878 = 0;
  if (0 < (int)uVar27) {
    local_878 = uVar27 & 0xffffffff;
  }
  uVar27 = 0;
  bVar8 = true;
  local_858 = p;
  do {
    bVar20 = bVar8;
    pVVar2 = local_858->vTtMem;
    uVar26 = (uint)uVar27;
    if (local_858->pPars->nLutSize < 7) {
      if ((long)pVVar2->nEntries <= (long)uVar27) goto LAB_0071d5e8;
      wVar3 = pVVar2->ppPages[uVar26 >> ((byte)pVVar2->LogPageSze & 0x1f)]
              [(long)(int)(pVVar2->PageMask & uVar26) * (long)pVVar2->nEntrySize];
      local_894 = 0;
      Abc_Tt6IsopCover(wVar3,wVar3,uVar26,(int *)local_838,(int *)&local_894);
      if ((long)(int)local_894 < 1) {
        uVar15 = 0;
      }
      else {
        lVar16 = 0;
        do {
          local_838[lVar16] = local_838[lVar16] | 1 << (char)uVar27 * '\x02';
          lVar16 = lVar16 + 1;
          uVar15 = local_894;
        } while ((int)local_894 != lVar16);
      }
      Abc_Tt6IsopCover(~wVar3,~wVar3,uVar26,(int *)local_838,(int *)&local_894);
      uVar24 = (ulong)local_894;
      if ((int)uVar15 < (int)local_894) {
        uVar17 = (ulong)uVar15;
        do {
          local_838[uVar17] = local_838[uVar17] | 2 << (char)uVar27 * '\x02';
          uVar17 = uVar17 + 1;
        } while (uVar24 != uVar17);
      }
      if (0x40 < (int)local_894) goto LAB_0071d607;
    }
    else {
      if ((long)pVVar2->nEntries <= (long)uVar27) goto LAB_0071d5e8;
      uVar26 = Abc_Tt8Cnf(pVVar2->ppPages[uVar26 >> ((byte)pVVar2->LogPageSze & 0x1f)] +
                          (long)(int)(pVVar2->PageMask & uVar26) * (long)pVVar2->nEntrySize,uVar26,
                          (int *)local_838);
      uVar24 = (ulong)uVar26;
    }
    iVar23 = (int)uVar24;
    iVar11 = iVar23;
    if (0 < iVar23) {
      uVar18 = 0;
      uVar17 = uVar24;
      do {
        if (bVar25) {
          uVar17 = (ulong)(((int)uVar17 + 1) - (uint)((local_838[uVar18] & 3) == 0));
        }
        iVar11 = (int)uVar17;
        uVar18 = uVar18 + 1;
      } while (uVar24 != uVar18);
    }
    if (uVar27 == local_878) goto LAB_0071d5c9;
    *(int *)((long)local_888 + uVar27 * 4) = iVar11;
    if ((long)p_00->nSize <= (long)uVar27) goto LAB_0071d5c9;
    p_00->pArray[uVar27] = p_00->nSize;
    Vec_IntPush(p_00,iVar23);
    if (0 < iVar23) {
      uVar27 = 0;
      do {
        Vec_IntPush(p_00,local_838[uVar27]);
        uVar27 = uVar27 + 1;
      } while (uVar24 != uVar27);
    }
    uVar27 = 1;
    bVar25 = true;
    bVar8 = false;
  } while (bVar20);
  pGVar14 = local_858->pGia;
  pVVar4 = pGVar14->vCos;
  *local_860 = pGVar14->vCis->nSize + 1 + pVVar4->nSize;
  *local_868 = pVVar4->nSize * 2 + 1;
  *local_870 = pVVar4->nSize * 4 + 1;
  if (0 < pGVar14->nObjs) {
    lVar16 = 0;
    pMVar22 = local_858;
    do {
      if ((~*(uint *)(pGVar14->pObjs + lVar16) & 0x1fffffff) != 0 &&
          -1 < (int)*(uint *)(pGVar14->pObjs + lVar16)) {
        if (0xffff < *(uint *)&pMVar22->pLfObjs[lVar16].field_0xc) {
          uVar26 = pMVar22->pLfObjs[lVar16].iCutSet;
          uVar15 = (int)uVar26 >> 0x10;
          if (((int)uVar15 < 0) || ((pMVar22->vPages).nSize <= (int)uVar15)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar5 = (pMVar22->vPages).pArray[uVar15];
          uVar27 = (ulong)(uVar26 & 0xffff);
          uVar26 = *(uint *)((long)pvVar5 + uVar27 * 4 + 4);
          uVar15 = uVar26 >> 6;
          uVar24 = (ulong)uVar15;
          if (p_00->nSize <= (int)uVar15) {
LAB_0071d626:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          piVar13 = *local_880;
          if (piVar13[uVar24] == -1) {
            pVVar2 = pMVar22->vTtMem;
            local_878 = CONCAT44(local_878._4_4_,p_00->nSize);
            local_850 = uVar27;
            local_848 = pvVar5;
            local_840 = piVar13;
            if (pMVar22->pPars->nLutSize < 7) {
              if (pVVar2->nEntries <= (int)uVar15) {
LAB_0071d5e8:
                __assert_fail("i >= 0 && i < p->nEntries",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecMem.h"
                              ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
              }
              wVar3 = pVVar2->ppPages[uVar15 >> ((byte)pVVar2->LogPageSze & 0x1f)]
                      [(ulong)(pVVar2->PageMask & uVar15) * (long)pVVar2->nEntrySize];
              uVar26 = uVar26 & 0x1f;
              local_894 = 0;
              Abc_Tt6IsopCover(wVar3,wVar3,uVar26,(int *)local_838,(int *)&local_894);
              if ((long)(int)local_894 < 1) {
                uVar29 = 0;
              }
              else {
                lVar19 = 0;
                do {
                  local_838[lVar19] = local_838[lVar19] | 1 << ((char)uVar26 * '\x02' & 0x1fU);
                  lVar19 = lVar19 + 1;
                  uVar29 = local_894;
                } while ((int)local_894 != lVar19);
              }
              Abc_Tt6IsopCover(~wVar3,~wVar3,uVar26,(int *)local_838,(int *)&local_894);
              if ((int)uVar29 < (int)local_894) {
                uVar27 = (ulong)uVar29;
                do {
                  local_838[uVar27] = local_838[uVar27] | 2 << ((char)uVar26 * '\x02' & 0x1fU);
                  uVar27 = uVar27 + 1;
                } while (local_894 != uVar27);
              }
              pMVar22 = local_858;
              uVar26 = local_894;
              if (0x40 < (int)local_894) {
LAB_0071d607:
                __assert_fail("nCubes <= 64",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                              ,0x805,"int Abc_Tt6Cnf(word, int, int *)");
              }
            }
            else {
              if (pVVar2->nEntries <= (int)uVar15) goto LAB_0071d5e8;
              uVar26 = Abc_Tt8Cnf(pVVar2->ppPages[uVar15 >> ((byte)pVVar2->LogPageSze & 0x1f)] +
                                  (ulong)(pVVar2->PageMask & uVar15) * (long)pVVar2->nEntrySize,
                                  uVar26 & 0x1f,(int *)local_838);
            }
            if ((pMVar22->vCnfSizes).nSize <= (int)uVar15) goto LAB_0071d626;
            if (uVar26 != (pMVar22->vCnfSizes).pArray[uVar24]) {
              __assert_fail("nCubes == Vec_IntEntry(&p->vCnfSizes, iFunc)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                            ,0x129,"Vec_Int_t *Mf_ManDeriveCnfs(Mf_Man_t *, int *, int *, int *)");
            }
            uVar29 = uVar26;
            if (0 < (int)uVar26) {
              uVar12 = *(uint *)((long)local_848 + local_850 * 4 + 4) & 0x1f;
              uVar1 = uVar12 - 1;
              uVar27 = 0;
              do {
                if (uVar12 != 0) {
                  uVar36 = local_838[uVar27];
                  uVar21 = uVar12 + 3 & 0xfffffffc;
                  uVar47 = 0;
                  uVar49 = 1;
                  uVar9 = 2;
                  uVar10 = 3;
                  uVar31 = 0;
                  uVar33 = 0;
                  uVar35 = 0;
                  do {
                    uVar34 = uVar35;
                    uVar32 = uVar33;
                    uVar30 = uVar31;
                    uVar28 = uVar29;
                    uVar40 = uVar10;
                    uVar39 = uVar9;
                    uVar38 = uVar49;
                    uVar37 = uVar47;
                    auVar44._4_4_ = uVar38 * 2;
                    auVar44._0_4_ = uVar37 * 2;
                    iVar11 = uVar39 * 2;
                    auVar44._8_4_ = iVar11;
                    iVar23 = uVar40 * 2;
                    auVar44._12_4_ = iVar23;
                    auVar43 = pshuflw(in_XMM6,auVar44,0xfe);
                    auVar44 = pshuflw(auVar43,auVar44,0x54);
                    auVar41._4_4_ = iVar23;
                    auVar41._0_4_ = iVar11;
                    auVar41._8_4_ = iVar11;
                    auVar41._12_4_ = iVar23;
                    auVar45 = pshuflw(auVar44,auVar41,0xfe);
                    auVar42._4_4_ = uVar36;
                    auVar42._0_4_ = uVar36;
                    auVar42._8_4_ = uVar36;
                    auVar42._12_4_ = uVar36;
                    uVar49 = (int)uVar36 >> auVar45;
                    auVar6._4_8_ = auVar42._8_8_;
                    auVar6._0_4_ = uVar49;
                    auVar48._0_8_ = auVar6._0_8_ << 0x20;
                    auVar48._8_4_ = uVar49;
                    auVar48._12_4_ = uVar49;
                    auVar42 = pshuflw(auVar41,auVar41,0x54);
                    auVar45._4_4_ = uVar36;
                    auVar45._0_4_ = uVar36;
                    auVar45._8_4_ = uVar36;
                    auVar45._12_4_ = uVar36;
                    uVar47 = (int)uVar36 >> auVar42;
                    auVar7._4_8_ = auVar45._8_8_;
                    auVar7._0_4_ = uVar47;
                    auVar46._0_8_ = auVar7._0_8_ << 0x20;
                    auVar46._8_4_ = uVar47;
                    auVar46._12_4_ = uVar47;
                    in_XMM6._8_8_ = auVar48._8_8_;
                    in_XMM6._0_8_ = auVar46._8_8_;
                    uVar29 = uVar28 + (((int)uVar36 >> auVar44 & 3U) != 0);
                    uVar31 = uVar30 + (((int)uVar36 >> auVar43 & 3U) != 0);
                    uVar33 = uVar32 + ((uVar47 & 3) != 0);
                    uVar35 = uVar34 + ((uVar49 & 3) != 0);
                    uVar21 = uVar21 - 4;
                    uVar47 = uVar37 + 4;
                    uVar49 = uVar38 + 4;
                    uVar9 = uVar39 + 4;
                    uVar10 = uVar40 + 4;
                  } while (uVar21 != 0);
                  uVar36 = -(uint)((int)(uVar1 ^ 0x80000000) < (int)(uVar37 ^ 0x80000000));
                  uVar21 = -(uint)((int)(uVar1 ^ 0x80000000) < (int)(uVar38 ^ 0x80000000));
                  uVar47 = -(uint)((int)(uVar1 ^ 0x80000000) < (int)(uVar39 ^ 0x80000000));
                  uVar49 = -(uint)((int)(uVar1 ^ 0x80000000) < (int)(uVar40 ^ 0x80000000));
                  uVar29 = (~uVar49 & uVar35 | uVar34 & uVar49) +
                           (~uVar21 & uVar31 | uVar30 & uVar21) +
                           (~uVar47 & uVar33 | uVar32 & uVar47) +
                           (~uVar36 & uVar29 | uVar28 & uVar36);
                }
                uVar27 = uVar27 + 1;
              } while (uVar27 != uVar26);
            }
            if ((int)local_890 <= (int)uVar15) {
LAB_0071d5c9:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            *(uint *)((long)local_888 + (ulong)(uVar15 * 4)) = uVar29;
            *(undefined4 *)((long)local_840 + (ulong)(uVar15 * 4)) = (undefined4)local_878;
            Vec_IntPush(p_00,uVar26);
            if (0 < (int)uVar26) {
              uVar27 = 0;
              do {
                Vec_IntPush(p_00,local_838[uVar27]);
                uVar27 = uVar27 + 1;
              } while (uVar26 != uVar27);
            }
          }
          *local_860 = *local_860 + 1;
          if ((pMVar22->vCnfSizes).nSize <= (int)uVar15) goto LAB_0071d626;
          *local_868 = *local_868 + (pMVar22->vCnfSizes).pArray[uVar24];
          if ((int)local_890 <= (int)uVar15) goto LAB_0071d626;
          *local_870 = *local_870 + *(int *)((long)local_888 + uVar24 * 4);
          pGVar14 = pMVar22->pGia;
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < pGVar14->nObjs);
  }
  if (local_888 != (void *)0x0) {
    free(local_888);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Mf_ManDeriveCnfs( Mf_Man_t * p, int * pnVars, int * pnClas, int * pnLits )
{
    int i, k, iFunc, nCubes, nLits, * pCut, pCnf[512];
    Vec_Int_t * vLits = Vec_IntStart( Vec_IntSize(&p->vCnfSizes) );
    Vec_Int_t * vCnfs = Vec_IntAlloc( 3 * Vec_IntSize(&p->vCnfSizes) );
    Vec_IntFill( vCnfs, Vec_IntSize(&p->vCnfSizes), -1 );
    assert( p->pPars->nLutSize <= 8 );
    // constant/buffer
    for ( iFunc = 0; iFunc < 2; iFunc++ )
    {
        if ( p->pPars->nLutSize <= 6 )
            nCubes = Abc_Tt6Cnf( *Vec_MemReadEntry(p->vTtMem, iFunc), iFunc, pCnf );
        else
            nCubes = Abc_Tt8Cnf( Vec_MemReadEntry(p->vTtMem, iFunc), iFunc, pCnf );
        nLits = Mf_ManCountLits( pCnf, nCubes, iFunc );
        Vec_IntWriteEntry( vLits, iFunc, nLits );
        Vec_IntWriteEntry( vCnfs, iFunc, Vec_IntSize(vCnfs) );
        Vec_IntPush( vCnfs, nCubes );
        for ( k = 0; k < nCubes; k++ )
            Vec_IntPush( vCnfs, pCnf[k] );
    }
    // other functions
    *pnVars = 1 + Gia_ManCiNum(p->pGia) + Gia_ManCoNum(p->pGia);
    *pnClas = 1 + 2 * Gia_ManCoNum(p->pGia);
    *pnLits = 1 + 4 * Gia_ManCoNum(p->pGia);
    Gia_ManForEachAndId( p->pGia, i )
    {
        if ( !Mf_ObjMapRefNum(p, i) )
            continue;
        pCut = Mf_ObjCutBest( p, i );
        iFunc = Abc_Lit2Var( Mf_CutFunc(pCut) );
        if ( Vec_IntEntry(vCnfs, iFunc) == -1 )
        {
            if ( p->pPars->nLutSize <= 6 )
                nCubes = Abc_Tt6Cnf( *Vec_MemReadEntry(p->vTtMem, iFunc), Mf_CutSize(pCut), pCnf );
            else
                nCubes = Abc_Tt8Cnf( Vec_MemReadEntry(p->vTtMem, iFunc), Mf_CutSize(pCut), pCnf );
            assert( nCubes == Vec_IntEntry(&p->vCnfSizes, iFunc) );
            nLits = Mf_ManCountLits( pCnf, nCubes, Mf_CutSize(pCut) );
            // save CNF
            Vec_IntWriteEntry( vLits, iFunc, nLits );
            Vec_IntWriteEntry( vCnfs, iFunc, Vec_IntSize(vCnfs) );
            Vec_IntPush( vCnfs, nCubes );
            for ( k = 0; k < nCubes; k++ )
                Vec_IntPush( vCnfs, pCnf[k] );
        }
        *pnVars += 1;
        *pnClas += Vec_IntEntry(&p->vCnfSizes, iFunc);
        *pnLits += Vec_IntEntry(vLits, iFunc);
    }
    Vec_IntFree( vLits );
    return vCnfs;
}